

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

int av1_get_adaptive_rdmult(AV1_COMP *cpi,double beta)

{
  FRAME_TYPE frame_type;
  FRAME_UPDATE_TYPE update_type;
  aom_bit_depth_t bit_depth;
  int use_fixed_qp_offsets;
  AV1_PRIMARY *pAVar1;
  int boost_index;
  int is_stat_consumption_stage;
  int iVar2;
  int layer_depth;
  
  pAVar1 = cpi->ppi;
  iVar2 = (pAVar1->p_rc).gfu_boost;
  boost_index = 0xf;
  if (iVar2 < 0x640) {
    boost_index = iVar2 / 100;
  }
  iVar2 = (pAVar1->gf_group).layer_depth[cpi->gf_frame_index];
  layer_depth = 6;
  if (iVar2 < 6) {
    layer_depth = iVar2;
  }
  frame_type = (cpi->common).current_frame.frame_type;
  iVar2 = (cpi->common).quant_params.base_qindex;
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  update_type = (pAVar1->gf_group).update_type[cpi->gf_frame_index];
  use_fixed_qp_offsets = (cpi->oxcf).q_cfg.use_fixed_qp_offsets;
  is_stat_consumption_stage = ::is_stat_consumption_stage(cpi);
  iVar2 = av1_compute_rd_mult(iVar2,bit_depth,update_type,layer_depth,boost_index,frame_type,
                              use_fixed_qp_offsets,is_stat_consumption_stage,
                              (cpi->oxcf).tune_cfg.tuning);
  return (int)((double)iVar2 / beta);
}

Assistant:

int av1_get_adaptive_rdmult(const AV1_COMP *cpi, double beta) {
  assert(beta > 0.0);
  const AV1_COMMON *cm = &cpi->common;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult = cm->quant_params.base_qindex;
  return (int)(av1_compute_rd_mult(
                   qindex_rdmult, cm->seq_params->bit_depth,
                   cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
                   layer_depth, boost_index, frame_type,
                   cpi->oxcf.q_cfg.use_fixed_qp_offsets,
                   is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning) /
               beta);
}